

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_earthshield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_earthshield);
  if (bVar1) {
    send_to_char("You are already surrounded by a shield of earth.\n\r",ch);
    return;
  }
  init_affect(&af);
  af.where = 0;
  af.aftype = 0;
  af.type = gsn_earthshield;
  af.level = (short)level;
  af.duration = (short)(level / 4);
  af.location = 0;
  af.modifier = 0;
  af.mod_name = 8;
  affect_to_char(ch,&af);
  send_to_char("You ready a shield of solid matter to deflect the bodies of your foes.\n\r",ch);
  act("$n\'s form is suddenly masked by an opaque gray shield that vanishes as quickly as it appeared."
      ,ch,(void *)0x0,(void *)0x0,0);
  return;
}

Assistant:

void spell_earthshield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_earthshield))
	{
		send_to_char("You are already surrounded by a shield of earth.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_earthshield;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 4;
	af.location = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("You ready a shield of solid matter to deflect the bodies of your foes.\n\r", ch);
	act("$n's form is suddenly masked by an opaque gray shield that vanishes as quickly as it appeared.", ch, 0, 0, TO_ROOM);
}